

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O0

void __thiscall DAGPropagator::~DAGPropagator(DAGPropagator *this)

{
  void *in_RDI;
  
  ~DAGPropagator(this);
  operator_delete(in_RDI);
  return;
}

Assistant:

DAGPropagator::~DAGPropagator() {
	for (int i = 0; i < nbNodes(); i++) {
		delete[] reachability[i];
	}
	delete[] reachability;
}